

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Read<double> __thiscall
Omega_h::subtract_each<double>(Omega_h *this,Read<double> *a,Read<double> *b)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  ulong uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar5;
  ulong uVar6;
  size_t sVar7;
  Read<double> RVar8;
  Write<double> c;
  type f;
  Write<double> local_78;
  type local_68;
  Write<double> local_38;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar6 = pAVar2->size;
  }
  else {
    uVar6 = (ulong)pAVar2 >> 3;
  }
  pAVar3 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    uVar4 = pAVar3->size;
  }
  else {
    uVar4 = (ulong)pAVar3 >> 3;
  }
  if ((int)(uVar6 >> 3) == (int)(uVar4 >> 3)) {
    if (((ulong)pAVar2 & 1) == 0) {
      sVar7 = pAVar2->size;
    }
    else {
      sVar7 = (ulong)pAVar2 >> 3;
    }
    local_68.c.shared_alloc_.alloc = (Alloc *)&local_68.a;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    Write<double>::Write(&local_78,(LO)(sVar7 >> 3),(string *)&local_68);
    if (local_68.c.shared_alloc_.alloc != (Alloc *)&local_68.a) {
      operator_delete(local_68.c.shared_alloc_.alloc,
                      (ulong)((long)&(local_68.a.write_.shared_alloc_.alloc)->size + 1));
    }
    local_68.c.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.c.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.c.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
    local_68.a.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_68.a.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.a.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.a.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.a.write_.shared_alloc_.alloc)->use_count =
             (local_68.a.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    local_68.b.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_68.b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.b.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.b.write_.shared_alloc_.alloc)->use_count =
             (local_68.b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.b.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
    if (((ulong)local_78.shared_alloc_.alloc & 1) == 0) {
      uVar6 = (local_78.shared_alloc_.alloc)->size;
    }
    else {
      uVar6 = (ulong)local_78.shared_alloc_.alloc >> 3;
    }
    parallel_for<Omega_h::subtract_each<double>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              ((LO)(uVar6 >> 3),&local_68,"subtract_each");
    local_38.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
    local_38.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
    if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
         local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
      local_38.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_78.shared_alloc_.alloc = (Alloc *)0x0;
    local_78.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)this,&local_38);
    pAVar2 = local_38.shared_alloc_.alloc;
    if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 &&
        local_38.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_38.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    subtract_each<double>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)&local_68);
    pAVar2 = local_78.shared_alloc_.alloc;
    pvVar5 = extraout_RDX;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar5 = extraout_RDX_00;
      }
    }
    RVar8.write_.shared_alloc_.direct_ptr = pvVar5;
    RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<double>)RVar8.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0xbf);
}

Assistant:

Read<T> subtract_each(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] - b[i]; };
  parallel_for(c.size(), f, "subtract_each");
  return c;
}